

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Worker.cpp
# Opt level: O2

void __thiscall adios2::query::Worker::~Worker(Worker *this)

{
  this->_vptr_Worker = (_func_int **)&PTR__Worker_00823088;
  if (this->m_Query != (QueryBase *)0x0) {
    (*this->m_Query->_vptr_QueryBase[1])();
  }
  std::__cxx11::string::~string((string *)&this->m_QueryFile);
  return;
}

Assistant:

Worker::~Worker()
{
    if (m_Query != nullptr)
        delete m_Query;
}